

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O2

void __thiscall OSTEI_VRR_Writer::WriteVRRFile(OSTEI_VRR_Writer *this,ostream *os,ostream *osh)

{
  _Rb_tree_node_base *p_Var1;
  OSTEI_VRR_Algorithm_Base *pOVar2;
  char cVar3;
  RRStepType RVar4;
  int iVar5;
  ostream *poVar6;
  size_type sVar7;
  _Base_ptr p_Var8;
  _Rb_tree_node_base *p_Var9;
  undefined1 am_00 [8];
  pointer am_01;
  char *pcVar10;
  OSTEI_VRR_Writer *this_00;
  string *this_01;
  long lVar11;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_579;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_578;
  allocator local_577;
  allocator local_576;
  allocator local_575;
  allocator local_574;
  allocator local_573;
  allocator local_572;
  allocator local_571;
  QAM am;
  undefined1 local_540 [8];
  _Rb_tree_node_base local_538;
  string *local_510;
  RRStepType local_504;
  string *local_500;
  string *local_4f8;
  string *local_4f0;
  string *local_4e8;
  string *local_4e0;
  QAMList local_4d8;
  ostream *local_4c0;
  undefined1 local_4b8 [12];
  int iStack_4ac;
  string local_4a8 [16];
  string local_498 [32];
  string local_478 [32];
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string stepchar;
  undefined1 local_398 [48];
  undefined1 local_368 [48];
  undefined1 local_338 [48];
  undefined1 local_308 [48];
  undefined1 local_2d8 [48];
  undefined1 local_2a8 [48];
  undefined1 local_278 [48];
  undefined1 local_248 [48];
  undefined1 local_218 [48];
  undefined1 local_1e8 [48];
  stringstream prototype;
  ostream local_1a8 [376];
  
  local_4c0 = osh;
  QAM::QAM(&am,&(this->info_->super_GeneratorInfoBase).finalam_);
  std::operator<<(os,"//////////////////////////////////////////////\n");
  poVar6 = std::operator<<(os,"// VRR: ( ");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[0]]);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[1]]);
  poVar6 = std::operator<<(poVar6," | ");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[2]]);
  poVar6 = std::operator<<(poVar6," ");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[3]]);
  std::operator<<(poVar6," )\n");
  std::operator<<(os,"//////////////////////////////////////////////\n");
  pOVar2 = this->vrr_algo_;
  QAM::QAM((QAM *)local_1e8,&am);
  RVar4 = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar2,(QAM *)local_1e8);
  std::__cxx11::string::~string((string *)(local_1e8 + 0x10));
  std::__cxx11::stringstream::stringstream((stringstream *)&prototype);
  RRStepTypeToStr_abi_cxx11_(&stepchar,RVar4);
  poVar6 = std::operator<<(local_1a8,"void VRR_");
  poVar6 = std::operator<<(poVar6,(string *)&stepchar);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[0]]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[1]]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[2]]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [am.qam._M_elems[3]]);
  std::operator<<(poVar6,"(\n");
  poVar6 = std::operator<<(local_1a8,(string *)&indent3_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"SIMINT_DBLTYPE * const restrict ");
  PrimVarName_abi_cxx11_((string *)local_4b8,&am);
  poVar6 = std::operator<<(poVar6,(string *)local_4b8);
  std::operator<<(poVar6,",\n");
  std::__cxx11::string::~string((string *)local_4b8);
  pOVar2 = this->vrr_algo_;
  QAM::QAM((QAM *)local_218,&am);
  local_504 = RVar4;
  OSTEI_VRR_Algorithm_Base::GetAMReq((QAMList *)local_540,pOVar2,(QAM *)local_218);
  std::__cxx11::string::~string((string *)(local_218 + 0x10));
  for (am_00 = local_540; am_00 != (undefined1  [8])local_538._0_8_;
      am_00 = (undefined1  [8])
              &(((OSTEI_VRR_Algorithm_Base *)am_00)->info_).super_GeneratorInfoBase.finalam_.tag.
               field_2) {
    poVar6 = std::operator<<(local_1a8,(string *)&indent3_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,"const SIMINT_DBLTYPE * const restrict ");
    PrimVarName_abi_cxx11_((string *)local_4b8,(QAM *)am_00);
    poVar6 = std::operator<<(poVar6,(string *)local_4b8);
    std::operator<<(poVar6,",\n");
    std::__cxx11::string::~string((string *)local_4b8);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector((vector<QAM,_std::allocator<QAM>_> *)local_540);
  pOVar2 = this->vrr_algo_;
  QAM::QAM((QAM *)local_248,&am);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)local_540,pOVar2,(QAM *)local_248);
  std::__cxx11::string::~string((string *)(local_248 + 0x10));
  local_510 = local_498;
  local_4e8 = local_478;
  local_4f0 = local_458;
  local_4f8 = local_438;
  local_500 = local_418;
  local_4e0 = local_3d8;
  for (p_Var8 = local_538._M_left; p_Var8 != &local_538;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    if (IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_ == '\0') {
      iVar5 = __cxa_guard_acquire(&IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_);
      if (iVar5 != 0) {
        std::__cxx11::string::string((string *)local_4b8,"P_PA",(allocator *)&local_4d8);
        std::__cxx11::string::string(local_498,"P_PB",&local_571);
        std::__cxx11::string::string(local_478,"Q_PA",&local_572);
        std::__cxx11::string::string(local_458,"Q_PB",&local_573);
        std::__cxx11::string::string(local_438,"PQ",&local_574);
        std::__cxx11::string::string(local_418,"Pxyz",&local_575);
        std::__cxx11::string::string(local_3f8,"aop_PQ",&local_576);
        std::__cxx11::string::string(local_3d8,"aoq_PQ",&local_577);
        __l._M_len = 8;
        __l._M_array = (iterator)local_4b8;
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,__l,&local_578,
              &local_579);
        lVar11 = 0xe0;
        do {
          std::__cxx11::string::~string((string *)(local_4b8 + lVar11));
          lVar11 = lVar11 + -0x20;
        } while (lVar11 != -0x20);
        __cxa_atexit(std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::~set,IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,&__dso_handle
                    );
        __cxa_guard_release(&IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_);
      }
    }
    sVar7 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)IsPointer(std::__cxx11::string_const&)::ptrvars_abi_cxx11_,
                    (key_type *)(p_Var8 + 1));
    if (sVar7 == 0) {
      poVar6 = std::operator<<(local_1a8,(string *)&indent3_abi_cxx11_);
      pcVar10 = "const SIMINT_DBLTYPE ";
    }
    else {
      poVar6 = std::operator<<(local_1a8,(string *)&indent3_abi_cxx11_);
      pcVar10 = "const SIMINT_DBLTYPE * ";
    }
    poVar6 = std::operator<<(poVar6,pcVar10);
    poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
    std::operator<<(poVar6,",\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_540);
  poVar6 = std::operator<<(local_1a8,(string *)&indent3_abi_cxx11_);
  RVar4 = local_504;
  std::operator<<(poVar6,"const int num_n)");
  std::__cxx11::stringbuf::str();
  poVar6 = std::operator<<(os,(string *)local_4b8);
  std::operator<<(poVar6,"\n");
  std::__cxx11::string::~string((string *)local_4b8);
  std::operator<<(os,"{\n");
  if (am.qam._M_elems[3] == 0 && am.qam._M_elems[1] == 0) {
    std::operator<<(os,"    int n = 0;\n");
    pOVar2 = this->vrr_algo_;
    QAM::QAM((QAM *)local_278,&am);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2p((IntSet *)local_4b8,pOVar2,(QAM *)local_278);
    std::__cxx11::string::~string((string *)(local_278 + 0x10));
    p_Var1 = (_Rb_tree_node_base *)(local_4b8 + 8);
    for (p_Var9 = (_Rb_tree_node_base *)local_4a8._8_8_; p_Var9 != p_Var1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"const SIMINT_DBLTYPE vrr_const_");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      poVar6 = std::operator<<(poVar6,"_over_2p = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      std::operator<<(poVar6,"), one_over_2p);\n");
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4b8);
    pOVar2 = this->vrr_algo_;
    QAM::QAM((QAM *)local_2a8,&am);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2q((IntSet *)local_4b8,pOVar2,(QAM *)local_2a8);
    std::__cxx11::string::~string((string *)(local_2a8 + 0x10));
    for (p_Var9 = (_Rb_tree_node_base *)local_4a8._8_8_; p_Var9 != p_Var1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"const SIMINT_DBLTYPE vrr_const_");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      poVar6 = std::operator<<(poVar6,"_over_2q = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      std::operator<<(poVar6,"), one_over_2q);\n");
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4b8);
    pOVar2 = this->vrr_algo_;
    QAM::QAM((QAM *)local_2d8,&am);
    OSTEI_VRR_Algorithm_Base::GetIntReq_2pq((IntSet *)local_4b8,pOVar2,(QAM *)local_2d8);
    std::__cxx11::string::~string((string *)(local_2d8 + 0x10));
    for (p_Var9 = (_Rb_tree_node_base *)local_4a8._8_8_; p_Var9 != p_Var1;
        p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
      poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
      poVar6 = std::operator<<(poVar6,"const SIMINT_DBLTYPE vrr_const_");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      poVar6 = std::operator<<(poVar6,"_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(");
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,p_Var9[1]._M_color);
      std::operator<<(poVar6,"), one_over_2pq);\n");
    }
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_4b8);
    QAM::QAM((QAM *)local_308,&am);
    pOVar2 = this->vrr_algo_;
    QAM::QAM((QAM *)local_338,&am);
    OSTEI_VRR_Algorithm_Base::GetSteps((VRR_StepSet *)local_4b8,pOVar2,(QAM *)local_338);
    this_00 = (OSTEI_VRR_Writer *)local_540;
    std::__cxx11::string::string((string *)this_00,"num_n",(allocator *)&local_4d8);
    WriteVRRSteps_(this_00,os,(QAM *)local_308,(VRR_StepSet *)local_4b8,(string *)local_540);
    std::__cxx11::string::~string((string *)local_540);
    std::
    _Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
    ::~_Rb_tree((_Rb_tree<VRRStep,_VRRStep,_std::_Identity<VRRStep>,_std::less<VRRStep>,_std::allocator<VRRStep>_>
                 *)local_4b8);
    std::__cxx11::string::~string((string *)(local_338 + 0x10));
    this_01 = (string *)(local_308 + 0x10);
    goto LAB_001194b0;
  }
  QAM::QAM((QAM *)local_4b8,&am);
  if (am.qam._M_elems[0] == 0) {
    local_4b8._0_8_ = CONCAT44((int)local_4b8._0_8_,SUB84(local_4b8._0_8_,4));
  }
  if (am.qam._M_elems[2] == 0) {
    register0x00001200 =
         CONCAT44((int)stack0xfffffffffffffb50,(int)(stack0xfffffffffffffb50 >> 0x20));
  }
  if (RVar4 == J) {
    cVar3 = 'I';
LAB_001191ca:
    std::__cxx11::string::operator=((string *)&stepchar,cVar3);
  }
  else if (RVar4 == L) {
    cVar3 = 'K';
    goto LAB_001191ca;
  }
  poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar6,"// Routines are identical except for swapping of\n");
  poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
  std::operator<<(poVar6,"// PA with PB and QC with QD\n");
  std::operator<<(os,"\n");
  poVar6 = std::operator<<(os,(string *)&indent1_abi_cxx11_);
  poVar6 = std::operator<<(poVar6,"VRR_");
  poVar6 = std::operator<<(poVar6,(string *)&stepchar);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(int)local_4b8._0_4_]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(int)local_4b8._4_4_]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [(int)local_4b8._8_4_]);
  poVar6 = std::operator<<(poVar6,"_");
  poVar6 = std::operator<<(poVar6,"spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"
                                  [iStack_4ac]);
  std::operator<<(poVar6,"(\n");
  poVar6 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  PrimVarName_abi_cxx11_((string *)local_540,&am);
  poVar6 = std::operator<<(poVar6,(string *)local_540);
  std::operator<<(poVar6,",\n");
  std::__cxx11::string::~string((string *)local_540);
  pOVar2 = this->vrr_algo_;
  QAM::QAM((QAM *)local_368,&am);
  OSTEI_VRR_Algorithm_Base::GetAMReq(&local_4d8,pOVar2,(QAM *)local_368);
  std::__cxx11::string::~string((string *)(local_368 + 0x10));
  for (am_01 = local_4d8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_start;
      am_01 != local_4d8.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
               super__Vector_impl_data._M_finish; am_01 = am_01 + 1) {
    poVar6 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
    PrimVarName_abi_cxx11_((string *)local_540,am_01);
    poVar6 = std::operator<<(poVar6,(string *)local_540);
    std::operator<<(poVar6,",\n");
    std::__cxx11::string::~string((string *)local_540);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_4d8);
  pOVar2 = this->vrr_algo_;
  QAM::QAM((QAM *)local_398,&am);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)local_540,pOVar2,(QAM *)local_398);
  std::__cxx11::string::~string((string *)(local_398 + 0x10));
  for (p_Var8 = local_538._M_left; p_Var8 != &local_538;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
    poVar6 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
    poVar6 = std::operator<<(poVar6,(string *)(p_Var8 + 1));
    std::operator<<(poVar6,",\n");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_540);
  poVar6 = std::operator<<(os,(string *)&indent3_abi_cxx11_);
  std::operator<<(poVar6,"num_n);");
  this_01 = local_4a8;
LAB_001194b0:
  std::__cxx11::string::~string(this_01);
  std::operator<<(os,"\n");
  std::operator<<(os,"}\n");
  std::operator<<(os,"\n\n");
  std::__cxx11::stringbuf::str();
  poVar6 = std::operator<<(local_4c0,(string *)local_4b8);
  std::operator<<(poVar6,";\n\n");
  std::__cxx11::string::~string((string *)local_4b8);
  std::__cxx11::string::~string((string *)&stepchar);
  std::__cxx11::stringstream::~stringstream((stringstream *)&prototype);
  std::__cxx11::string::~string((string *)&am.tag);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRRFile(std::ostream & os, std::ostream & osh) const
{
    QAM am = info_.FinalAM();

    os << "//////////////////////////////////////////////\n";
    os << "// VRR: ( " << amchar[am[0]] << " " << amchar[am[1]] << " | " << amchar[am[2]] << " " << amchar[am[3]] << " )\n";
    os << "//////////////////////////////////////////////\n";

    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    std::stringstream prototype;

    std::string stepchar = RRStepTypeToStr(rrstep);

    prototype << "void VRR_" << stepchar << "_"
              << amchar[am[0]] << "_" << amchar[am[1]] << "_"
              << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    // final target
    prototype << indent3 << "SIMINT_DBLTYPE * const restrict " << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        prototype << indent3 << "const SIMINT_DBLTYPE * const restrict " << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
    {
        if(IsPointer(it))
            prototype << indent3 << "const SIMINT_DBLTYPE * " << it << ",\n";
        else
            prototype << indent3 << "const SIMINT_DBLTYPE " << it << ",\n";
    }

    prototype << indent3 << "const int num_n)";

    os << prototype.str() << "\n";
    os << "{\n";


    // is this in standard order, or one of the permutations?
    if(am[1] == 0 && am[3] == 0)
    {
        // standard ( X s | Y s )
        // Make this one

        os << "    int n = 0;\n";

        for(const auto & it : vrr_algo_.GetIntReq_2p(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2p);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2q(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2q);\n"; 

        for(const auto & it : vrr_algo_.GetIntReq_2pq(am))
            os << indent1 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(SIMINT_DBLSET1(" << it << "), one_over_2pq);\n"; 

        // Write out the steps
        WriteVRRSteps_(os, am, vrr_algo_.GetSteps(am), "num_n");

    }
    else
    {
        // permutation. Call one of the others
        QAM tocall = am;
        if(am[0] == 0)
            std::swap(tocall[0], tocall[1]);
        if(am[2] == 0)
            std::swap(tocall[2], tocall[3]);

        if(rrstep == RRStepType::J)
            stepchar = 'I';
        else if(rrstep == RRStepType::L)
            stepchar = 'K';

        os << indent1 << "// Routines are identical except for swapping of\n";
        os << indent1 << "// PA with PB and QC with QD\n";
        os << "\n";
        os << indent1 << "VRR_" << stepchar << "_"
                      << amchar[tocall[0]] << "_" << amchar[tocall[1]] << "_"
                      << amchar[tocall[2]] << "_" << amchar[tocall[3]]  << "(\n";
    
        // final target
        os << indent3 << PrimVarName(am) << ",\n";
        
        for(const auto & it : vrr_algo_.GetAMReq(am))
            os << indent3 << PrimVarName(it) << ",\n";
    
        for(const auto & it : vrr_algo_.GetVarReq(am))
            os << indent3 << it << ",\n";

        os << indent3 << "num_n);";
    }

    os << "\n";
    os << "}\n";
    os << "\n\n";

    // header
    osh << prototype.str() << ";\n\n";
}